

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wining-state.cpp
# Opt level: O0

void __thiscall
mahjong::WiningState::winByDiscard(WiningState *this,WinByDiscardSituation situation)

{
  byte local_22;
  byte local_21;
  WiningState *this_local;
  WinByDiscardSituation situation_local;
  
  this->is_win_by_discard = true;
  this_local._5_1_ = situation.is_one_shot;
  this->is_one_shot = (bool)(this_local._5_1_ & 1);
  this_local._6_1_ = situation.is_last_discard;
  this->is_last_discard = (bool)(this_local._6_1_ & 1);
  this->is_robbing_quad = (bool)(situation.is_robbing_quad & 1);
  if (((this->is_last_discard & 1U) == 0) || (local_21 = 0, (this->is_robbing_quad & 1U) == 0)) {
    local_22 = 0;
    if ((this->is_last_discard & 1U) != 0) {
      local_22 = this->is_one_shot;
    }
    local_21 = local_22 ^ 0xff;
  }
  if ((local_21 & 1) == 0) {
    __assert_fail("!(is_last_discard && is_robbing_quad) && !(is_last_discard && is_one_shot)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/src/wining-state.cpp"
                  ,0x16,"void mahjong::WiningState::winByDiscard(WinByDiscardSituation)");
  }
  return;
}

Assistant:

void WiningState::winByDiscard(WinByDiscardSituation situation)
{
	is_win_by_discard = true;

	is_one_shot = situation.is_one_shot;
	is_last_discard = situation.is_last_discard;
	is_robbing_quad = situation.is_robbing_quad;
	assert(
		!(is_last_discard && is_robbing_quad) &&
		!(is_last_discard && is_one_shot)
	);
}